

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O1

void __thiscall HMatrix::compute_vecT_matB(HMatrix *this,double *vec,int *base,HVector *result)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  double dVar11;
  
  HVector::clear(result);
  if (this->numRow < 1) {
    iVar9 = 0;
  }
  else {
    piVar3 = (result->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (result->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->Astart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->Aindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    iVar9 = 0;
    do {
      iVar1 = base[lVar8];
      if (iVar1 < this->numCol) {
        iVar2 = piVar5[iVar1];
        lVar10 = (long)iVar2;
        iVar1 = piVar5[(long)iVar1 + 1];
        dVar11 = 0.0;
        if (iVar2 < iVar1) {
          do {
            dVar11 = dVar11 + vec[piVar6[lVar10]] * pdVar7[lVar10];
            lVar10 = lVar10 + 1;
          } while (iVar1 != lVar10);
        }
      }
      else {
        dVar11 = vec[iVar1 - this->numCol];
      }
      if (1e-14 < ABS(dVar11)) {
        pdVar4[lVar8] = dVar11;
        lVar10 = (long)iVar9;
        iVar9 = iVar9 + 1;
        piVar3[lVar10] = (int)lVar8;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->numRow);
  }
  result->count = iVar9;
  return;
}

Assistant:

void HMatrix::compute_vecT_matB(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];
    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = 0;
        if (iCol < numCol) {
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                value += vec[Aindex[k]] * Avalue[k];
        } else {
            value = vec[iCol - numCol];
        }
        if (fabs(value) > HSOL_CONST_TINY) {
            resultArray[i] = value;
            resultIndex[resultCount++] = i;
        }
    }
    result->count = resultCount;
}